

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O1

TestStatus * __thiscall
vkt::api::anon_unknown_1::createMaxConcurrentTest<vkt::api::(anonymous_namespace)::Buffer>
          (TestStatus *__return_storage_ptr__,anon_unknown_1 *this,Context *context,
          Parameters params)

{
  int *piVar1;
  deUint64 dVar2;
  long *plVar3;
  pointer pSVar4;
  deUint32 dVar5;
  VkDeviceSize objectDeviceMemorySize;
  VkAllocationCallbacks *allocator;
  DeviceInterface *pDVar6;
  VkDevice pVVar7;
  size_t sVar8;
  size_t sVar9;
  char *__s;
  size_t sVar10;
  deUint64 *pdVar11;
  long *plVar12;
  VkBufferUsageFlags VVar13;
  ulong uVar14;
  size_type __n;
  long lVar15;
  Environment env_2;
  Environment env;
  Unique<vk::Handle<(vk::HandleType)8>_> buffer;
  Unique<vk::Handle<(vk::HandleType)8>_> obj;
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>_>_>_>
  objects;
  AllocationCallbackRecorder allocRecorder;
  Move<vk::Handle<(vk::HandleType)8>_> local_2e8;
  undefined8 local_2c8;
  VkAllocationCallbacks *local_2c0;
  undefined4 local_2b8;
  undefined1 local_2a8 [20];
  uint uStack_294;
  Context *pCStack_290;
  VkBufferUsageFlags local_288;
  VkSharingMode VStack_284;
  deUint32 dStack_280;
  undefined4 uStack_27c;
  VkAllocationCallbacks **local_278;
  VkBuffer local_268;
  Deleter<vk::Handle<(vk::HandleType)8>_> DStack_260;
  VkBuffer local_248;
  Deleter<vk::Handle<(vk::HandleType)8>_> DStack_240;
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>_>_>_>
  local_220;
  deUint32 local_208 [2];
  undefined8 local_200;
  undefined8 local_1f8;
  undefined4 local_1f0;
  Move<vk::Handle<(vk::HandleType)8>_> local_1e8;
  VkMemoryRequirements local_1c8;
  undefined1 local_1b0 [8];
  VkAllocationCallbacks local_1a8 [2];
  ios_base local_138 [264];
  
  VVar13 = (VkBufferUsageFlags)params.size;
  local_220.
  super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = *(pointer *)(this + 8);
  local_220.
  super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)Context::getDeviceInterface((Context *)this)
  ;
  local_220.
  super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)Context::getDevice((Context *)this);
  local_208[0] = Context::getUniversalQueueFamilyIndex((Context *)this);
  local_200 = *(undefined8 *)(this + 0x10);
  local_1f8 = 0;
  local_1f0 = 1;
  local_1b0._0_4_ = VK_STRUCTURE_TYPE_BUFFER_CREATE_INFO;
  local_1a8[0].pUserData = (void *)0x0;
  local_1a8[0].pfnAllocation._0_4_ = 0;
  local_1a8[0]._28_8_ = 0x100000000;
  local_1a8[0].pfnReallocation = (PFN_vkReallocationFunction)context;
  local_1a8[0].pfnFree._0_4_ = VVar13;
  local_1a8[0].pfnInternalFree = (PFN_vkInternalFreeNotification)local_208;
  ::vk::createBuffer((Move<vk::Handle<(vk::HandleType)8>_> *)local_2a8,
                     (DeviceInterface *)
                     local_220.
                     super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish,
                     (VkDevice)
                     local_220.
                     super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,
                     (VkBufferCreateInfo *)local_1b0,(VkAllocationCallbacks *)0x0);
  local_268.m_internal = local_2a8._0_8_;
  DStack_260.m_deviceIface = (DeviceInterface *)local_2a8._8_8_;
  DStack_260.m_device = stack0xfffffffffffffd68;
  DStack_260.m_allocator = (VkAllocationCallbacks *)pCStack_290;
  ::vk::getBufferMemoryRequirements
            (&local_1c8,
             (DeviceInterface *)
             local_220.
             super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish,
             (VkDevice)
             local_220.
             super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage,(VkBuffer)local_2a8._0_8_);
  objectDeviceMemorySize = getPageTableSize((Context *)this,local_1c8.size);
  allocator = ::vk::getSystemAllocator();
  ::vk::AllocationCallbackRecorder::AllocationCallbackRecorder
            ((AllocationCallbackRecorder *)local_1b0,allocator,0x400);
  dVar2 = *(deUint64 *)(this + 8);
  pDVar6 = Context::getDeviceInterface((Context *)this);
  pVVar7 = Context::getDevice((Context *)this);
  dVar5 = Context::getUniversalQueueFamilyIndex((Context *)this);
  local_2c8 = *(undefined8 *)(this + 0x10);
  local_2e8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)
       CONCAT44(local_2e8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator.
                _4_4_,dVar5);
  local_2b8 = 1;
  local_2e8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal = dVar2;
  local_2e8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface = pDVar6;
  local_2e8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device = pVVar7;
  local_2c0 = local_1a8;
  sVar8 = getCurrentSystemMemoryUsage((AllocationCallbackRecorder *)local_1b0);
  local_278 = &local_2e8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator;
  local_2a8._0_4_ = 0xc;
  local_2a8._8_8_ = (DeviceInterface *)0x0;
  stack0xfffffffffffffd68 = (VkDevice)((ulong)uStack_294 << 0x20);
  VStack_284 = VK_SHARING_MODE_EXCLUSIVE;
  dStack_280 = 1;
  pCStack_290 = context;
  local_288 = VVar13;
  ::vk::createBuffer(&local_1e8,
                     local_2e8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.
                     m_deviceIface,
                     local_2e8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device
                     ,(VkBufferCreateInfo *)local_2a8,local_2c0);
  local_248.m_internal =
       local_1e8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal;
  DStack_240.m_deviceIface =
       local_1e8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface;
  DStack_240.m_device =
       local_1e8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device;
  DStack_240.m_allocator =
       local_1e8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator;
  sVar9 = getCurrentSystemMemoryUsage((AllocationCallbackRecorder *)local_1b0);
  if (local_248.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()(&DStack_240,local_248);
  }
  ::vk::AllocationCallbackRecorder::~AllocationCallbackRecorder
            ((AllocationCallbackRecorder *)local_1b0);
  sVar8 = getSafeObjectCount((Context *)this,sVar9 - sVar8,objectDeviceMemorySize);
  if (local_268.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()(&DStack_260,local_268);
  }
  __n = 0x4000;
  if (sVar8 < 0x4000) {
    __n = sVar8;
  }
  local_2a8._0_8_ = *(undefined8 *)(this + 8);
  local_2a8._8_8_ = Context::getDeviceInterface((Context *)this);
  register0x00000000 = Context::getDevice((Context *)this);
  dVar5 = Context::getUniversalQueueFamilyIndex((Context *)this);
  pCStack_290 = (Context *)CONCAT44(pCStack_290._4_4_,dVar5);
  local_288 = (VkBufferUsageFlags)*(undefined8 *)(this + 0x10);
  VStack_284 = (VkSharingMode)((ulong)*(undefined8 *)(this + 0x10) >> 0x20);
  dStack_280 = 0;
  uStack_27c = 0;
  local_278 = (VkAllocationCallbacks **)CONCAT44(local_278._4_4_,(int)__n);
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>_>_>_>
  ::vector(&local_220,__n,(allocator_type *)local_1b0);
  local_1b0 = *(undefined1 (*) [8])(*(long *)this + 0x10);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Creating ",9);
  std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," ",1);
  __s = ::vk::getTypeName<vk::Handle<(vk::HandleType)8>>();
  if (__s == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)((long)local_1a8[0].pUserData + -0x18) + (int)local_1a8);
  }
  else {
    sVar10 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,__s,sVar10);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," objects",8);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  if (sVar8 != 0) {
    lVar15 = 8;
    uVar14 = 0;
    do {
      pdVar11 = (deUint64 *)operator_new(0x20);
      local_1b0._0_4_ = VK_STRUCTURE_TYPE_BUFFER_CREATE_INFO;
      local_1a8[0].pUserData = (void *)0x0;
      local_1a8[0].pfnAllocation._0_4_ = 0;
      local_1a8[0]._28_8_ = 0x100000000;
      local_1a8[0].pfnInternalFree = (PFN_vkInternalFreeNotification)&pCStack_290;
      local_1a8[0].pfnReallocation = (PFN_vkReallocationFunction)context;
      local_1a8[0].pfnFree._0_4_ = VVar13;
      ::vk::createBuffer(&local_2e8,(DeviceInterface *)local_2a8._8_8_,stack0xfffffffffffffd68,
                         (VkBufferCreateInfo *)local_1b0,
                         (VkAllocationCallbacks *)CONCAT44(uStack_27c,dStack_280));
      pdVar11[2] = (deUint64)
                   local_2e8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device;
      pdVar11[3] = (deUint64)
                   local_2e8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.
                   m_allocator;
      *pdVar11 = local_2e8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal;
      pdVar11[1] = (deUint64)
                   local_2e8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.
                   m_deviceIface;
      local_2e8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal = 0;
      local_2e8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface =
           (DeviceInterface *)0x0;
      local_2e8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device =
           (VkDevice)0x0;
      local_2e8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator =
           (VkAllocationCallbacks *)0x0;
      plVar12 = (long *)operator_new(0x20);
      pSVar4 = local_220.
               super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      *(undefined4 *)(plVar12 + 1) = 0;
      *(undefined4 *)((long)plVar12 + 0xc) = 0;
      *plVar12 = (long)&PTR__SharedPtrState_00d53460;
      plVar12[2] = (long)pdVar11;
      *(undefined4 *)(plVar12 + 1) = 1;
      *(undefined4 *)((long)plVar12 + 0xc) = 1;
      plVar3 = *(long **)((long)&(local_220.
                                  super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->m_ptr + lVar15);
      if (plVar3 != plVar12) {
        if (plVar3 != (long *)0x0) {
          LOCK();
          plVar3 = plVar3 + 1;
          *(int *)plVar3 = (int)*plVar3 + -1;
          UNLOCK();
          if ((int)*plVar3 == 0) {
            *(undefined8 *)
             ((long)local_220.
                    super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + lVar15 + -8) = 0;
            (**(code **)(**(long **)((long)&(local_220.
                                             super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start)->m_ptr +
                                    lVar15) + 0x10))();
          }
          LOCK();
          piVar1 = (int *)(*(long *)((long)&pSVar4->m_ptr + lVar15) + 0xc);
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if (*piVar1 == 0) {
            plVar3 = *(long **)((long)&pSVar4->m_ptr + lVar15);
            if (plVar3 != (long *)0x0) {
              (**(code **)(*plVar3 + 8))();
            }
            *(undefined8 *)((long)&pSVar4->m_ptr + lVar15) = 0;
          }
        }
        *(deUint64 **)((long)pSVar4 + lVar15 + -8) = pdVar11;
        *(long **)((long)&pSVar4->m_ptr + lVar15) = plVar12;
        LOCK();
        *(int *)(plVar12 + 1) = (int)plVar12[1] + 1;
        UNLOCK();
        LOCK();
        piVar1 = (int *)(*(long *)((long)&pSVar4->m_ptr + lVar15) + 0xc);
        *piVar1 = *piVar1 + 1;
        UNLOCK();
      }
      LOCK();
      plVar3 = plVar12 + 1;
      *(int *)plVar3 = (int)*plVar3 + -1;
      UNLOCK();
      if ((int)*plVar3 == 0) {
        (**(code **)(*plVar12 + 0x10))(plVar12);
      }
      LOCK();
      piVar1 = (int *)((long)plVar12 + 0xc);
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        (**(code **)(*plVar12 + 8))(plVar12);
      }
      if (local_2e8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal != 0) {
        ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
                  (&local_2e8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter,
                   (VkBuffer)
                   local_2e8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal)
        ;
      }
      if ((uVar14 & 0x3ff) == 0 && uVar14 != 0) {
        tcu::TestContext::touchWatchdog(*(TestContext **)this);
      }
      uVar14 = uVar14 + 1;
      lVar15 = lVar15 + 0x10;
    } while (__n != uVar14);
  }
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>_>_>_>
  ::_M_erase_at_end(&local_220,
                    local_220.
                    super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  local_1b0 = (undefined1  [8])&local_1a8[0].pfnAllocation;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,"Ok","");
  __return_storage_ptr__->m_code = QP_TEST_RESULT_PASS;
  (__return_storage_ptr__->m_description)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->m_description).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&__return_storage_ptr__->m_description,local_1b0,
             (undefined1 *)((long)local_1a8[0].pUserData + (long)local_1b0));
  if (local_1b0 != (undefined1  [8])&local_1a8[0].pfnAllocation) {
    operator_delete((void *)local_1b0,
                    CONCAT44(local_1a8[0].pfnAllocation._4_4_,
                             (VkBufferCreateFlags)local_1a8[0].pfnAllocation) + 1);
  }
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>_>_>_>
  ::~vector(&local_220);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus createMaxConcurrentTest (Context& context, typename Object::Parameters params)
{
	typedef Unique<typename Object::Type>	UniqueObject;
	typedef SharedPtr<UniqueObject>			ObjectPtr;

	const deUint32						numObjects			= Object::getMaxConcurrent(context, params);
	const Environment					env					(context, numObjects);
	const typename Object::Resources	res					(env, params);
	vector<ObjectPtr>					objects				(numObjects);
	const deUint32						watchdogInterval	= 1024;

	context.getTestContext().getLog()
		<< TestLog::Message << "Creating " << numObjects << " " << getTypeName<typename Object::Type>() << " objects" << TestLog::EndMessage;

	for (deUint32 ndx = 0; ndx < numObjects; ndx++)
	{
		objects[ndx] = ObjectPtr(new UniqueObject(Object::create(env, res, params)));

		if ((ndx > 0) && ((ndx % watchdogInterval) == 0))
			context.getTestContext().touchWatchdog();
	}

	objects.clear();

	return tcu::TestStatus::pass("Ok");
}